

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O2

void av1_get_entropy_contexts
               (BLOCK_SIZE plane_bsize,macroblockd_plane *pd,ENTROPY_CONTEXT *t_above,
               ENTROPY_CONTEXT *t_left)

{
  byte bVar1;
  ENTROPY_CONTEXT *__src;
  ulong uVar2;
  undefined7 in_register_00000039;
  
  uVar2 = CONCAT71(in_register_00000039,plane_bsize) & 0xffffffff;
  bVar1 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar2];
  __src = pd->left_entropy_context;
  memcpy(t_above,pd->above_entropy_context,
         (ulong)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar2])
  ;
  memcpy(t_left,__src,(ulong)bVar1);
  return;
}

Assistant:

void av1_get_entropy_contexts(BLOCK_SIZE plane_bsize,
                              const struct macroblockd_plane *pd,
                              ENTROPY_CONTEXT t_above[MAX_MIB_SIZE],
                              ENTROPY_CONTEXT t_left[MAX_MIB_SIZE]) {
  assert(plane_bsize < BLOCK_SIZES_ALL);
  get_entropy_contexts_plane(plane_bsize, pd, t_above, t_left);
}